

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

xmlChar * xmlGetActualEncoding(xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  xmlParserInputBufferPtr pxVar2;
  xmlCharEncodingHandlerPtr pxVar3;
  xmlChar *pxVar4;
  
  uVar1 = ctxt->input->flags;
  if ((uVar1 & 0x1e) != 0) {
    return ctxt->encoding;
  }
  pxVar2 = ctxt->input->buf;
  if ((pxVar2 != (xmlParserInputBufferPtr)0x0) &&
     (pxVar3 = pxVar2->encoder, pxVar3 != (xmlCharEncodingHandlerPtr)0x0)) {
    return (xmlChar *)pxVar3->name;
  }
  pxVar4 = (xmlChar *)0x0;
  if ((uVar1 & 1) != 0) {
    pxVar4 = "UTF-8";
  }
  return pxVar4;
}

Assistant:

const xmlChar *
xmlGetActualEncoding(xmlParserCtxtPtr ctxt) {
    const xmlChar *encoding = NULL;

    if ((ctxt->input->flags & XML_INPUT_USES_ENC_DECL) ||
        (ctxt->input->flags & XML_INPUT_AUTO_ENCODING)) {
        /* Preserve encoding exactly */
        encoding = ctxt->encoding;
    } else if ((ctxt->input->buf) && (ctxt->input->buf->encoder)) {
        encoding = BAD_CAST ctxt->input->buf->encoder->name;
    } else if (ctxt->input->flags & XML_INPUT_HAS_ENCODING) {
        encoding = BAD_CAST "UTF-8";
    }

    return(encoding);
}